

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O1

void __thiscall
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::GridRecalculatePrimRef,_2UL>::
TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,GridRecalculatePrimRef *recalculatePrimRef)

{
  ushort uVar1;
  ushort uVar2;
  SubGridBuildData *pSVar3;
  Geometry *pGVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  undefined4 uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ushort uVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  long lVar21;
  ushort uVar22;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  float fVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar40;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  undefined1 auVar39 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar45;
  float fVar46;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar44;
  float fVar47;
  float fVar48;
  float fVar53;
  float fVar54;
  undefined1 auVar49 [16];
  float fVar55;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar56;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar64;
  float fVar65;
  float fVar69;
  float fVar70;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar82;
  float fVar83;
  
  fVar26 = time_range.lower;
  fVar30 = time_range.upper;
  fVar42 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar34 = (set->super_PrimInfoMB).max_time_range.upper - fVar42;
  fVar28 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar27 = roundf((((fVar26 * 0.5 + fVar30 * 0.5) - fVar42) / fVar34) * fVar28);
  fVar42 = (fVar27 / fVar28) * fVar34 + fVar42;
  if (begin < end && !(bool)(~(fVar26 < fVar42 && fVar42 < fVar30) & 1)) {
    do {
      if ((fVar26 < prims[begin].time_range.upper * 0.9999) &&
         (prims[begin].time_range.lower * 1.0001 < fVar42)) {
        fVar27 = prims[begin].lbounds.bounds0.upper.field_0.m128[3];
        pSVar3 = recalculatePrimRef->sgrids;
        pGVar4 = (recalculatePrimRef->scene->geometries).items
                 [(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3]].ptr;
        uVar19 = (ulong)pSVar3[(uint)fVar27].sx & 0x7fff;
        uVar23 = (ulong)pSVar3[(uint)fVar27].sy & 0x7fff;
        lVar5 = *(long *)&pGVar4->field_0x58;
        lVar21 = (ulong)pSVar3[(uint)fVar27].primID *
                 pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
        fVar27 = pGVar4->fnumTimeSegments;
        fVar28 = (pGVar4->time_range).lower;
        fVar31 = (pGVar4->time_range).upper - fVar28;
        fVar35 = (fVar26 - fVar28) / fVar31;
        fVar31 = (fVar42 - fVar28) / fVar31;
        fVar47 = fVar27 * fVar31;
        fVar34 = floorf(fVar27 * fVar35);
        fVar28 = ceilf(fVar47);
        iVar9 = (int)fVar34;
        if (fVar34 <= 0.0) {
          fVar34 = 0.0;
        }
        if (iVar9 < 0) {
          iVar9 = -1;
        }
        iVar10 = (int)fVar27 + 1;
        if ((int)fVar28 < (int)fVar27 + 1) {
          iVar10 = (int)fVar28;
        }
        uVar1 = *(ushort *)(lVar5 + 10 + lVar21);
        uVar11 = (ulong)uVar1;
        if (uVar23 + 3 < (ulong)uVar1) {
          uVar11 = uVar23 + 3;
        }
        uVar22 = (ushort)uVar23;
        uVar18 = (ushort)uVar19;
        auVar52 = _DAT_01feb9f0;
        auVar75 = _DAT_01feba00;
        if (uVar22 < uVar1) {
          uVar2 = *(ushort *)(lVar5 + 8 + lVar21);
          uVar13 = (ulong)uVar2;
          if (uVar19 + 3 < (ulong)uVar2) {
            uVar13 = uVar19 + 3;
          }
          bVar25 = true;
          uVar15 = uVar23;
          auVar36 = _DAT_01feba00;
          auVar49 = _DAT_01feb9f0;
          do {
            if (uVar18 < uVar2) {
              uVar17 = *(ulong *)&pGVar4[2].numPrimitives;
              lVar24 = (long)(int)fVar34 * 0x38;
              lVar16 = *(long *)(uVar17 + 0x10 + lVar24);
              pauVar20 = (undefined1 (*) [16])
                         ((*(uint *)(lVar5 + lVar21) + uVar19 +
                          *(uint *)(lVar5 + 4 + lVar21) * uVar15) * lVar16 +
                         *(long *)(uVar17 + lVar24));
              lVar24 = uVar13 - uVar19;
              do {
                auVar52 = *pauVar20;
                auVar75._0_4_ = -(uint)(auVar52._0_4_ < 1.844e+18 && -1.844e+18 < auVar52._0_4_);
                auVar75._4_4_ = -(uint)(auVar52._4_4_ < 1.844e+18 && -1.844e+18 < auVar52._4_4_);
                auVar75._8_4_ = -(uint)(auVar52._8_4_ < 1.844e+18 && -1.844e+18 < auVar52._8_4_);
                auVar75._12_4_ = -(uint)(auVar52._12_4_ < 1.844e+18 && -1.844e+18 < auVar52._12_4_);
                uVar12 = movmskps((int)uVar17,auVar75);
                uVar17 = (ulong)CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12);
                if ((~(byte)uVar12 & 7) != 0) {
                  auVar52 = _DAT_01feb9f0;
                  auVar75 = _DAT_01feba00;
                  if (!bVar25) {
                    auVar52 = auVar49;
                    auVar75 = auVar36;
                  }
                  goto LAB_00d7dd96;
                }
                auVar49 = minps(auVar49,auVar52);
                auVar36 = maxps(auVar36,auVar52);
                pauVar20 = (undefined1 (*) [16])(*pauVar20 + lVar16);
                lVar24 = lVar24 + -1;
              } while (lVar24 != 0);
            }
            uVar15 = uVar15 + 1;
            bVar25 = uVar15 < uVar11;
            auVar52 = auVar49;
            auVar75 = auVar36;
          } while (uVar15 != uVar11);
        }
LAB_00d7dd96:
        if (fVar27 <= fVar28) {
          fVar28 = fVar27;
        }
        auVar36 = _DAT_01feb9f0;
        auVar49 = _DAT_01feba00;
        if (uVar22 < uVar1) {
          uVar2 = *(ushort *)(lVar5 + 8 + lVar21);
          uVar13 = (ulong)uVar2;
          if (uVar19 + 3 < (ulong)uVar2) {
            uVar13 = uVar19 + 3;
          }
          bVar25 = true;
          lVar16 = (long)(int)fVar28 * 0x38;
          uVar15 = uVar23;
          auVar57 = _DAT_01feba00;
          auVar66 = _DAT_01feb9f0;
          do {
            if (uVar18 < uVar2) {
              uVar17 = *(ulong *)&pGVar4[2].numPrimitives;
              lVar24 = *(long *)(uVar17 + 0x10 + lVar16);
              pauVar20 = (undefined1 (*) [16])
                         ((*(uint *)(lVar5 + lVar21) + uVar19 +
                          *(uint *)(lVar5 + 4 + lVar21) * uVar15) * lVar24 +
                         *(long *)(uVar17 + lVar16));
              lVar8 = uVar13 - uVar19;
              do {
                auVar36 = *pauVar20;
                auVar49._0_4_ = -(uint)(auVar36._0_4_ < 1.844e+18 && -1.844e+18 < auVar36._0_4_);
                auVar49._4_4_ = -(uint)(auVar36._4_4_ < 1.844e+18 && -1.844e+18 < auVar36._4_4_);
                auVar49._8_4_ = -(uint)(auVar36._8_4_ < 1.844e+18 && -1.844e+18 < auVar36._8_4_);
                auVar49._12_4_ = -(uint)(auVar36._12_4_ < 1.844e+18 && -1.844e+18 < auVar36._12_4_);
                uVar12 = movmskps((int)uVar17,auVar49);
                uVar17 = (ulong)CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12);
                if ((~(byte)uVar12 & 7) != 0) {
                  auVar36 = _DAT_01feb9f0;
                  auVar49 = _DAT_01feba00;
                  if (!bVar25) {
                    auVar36 = auVar66;
                    auVar49 = auVar57;
                  }
                  goto LAB_00d7de77;
                }
                auVar66 = minps(auVar66,auVar36);
                auVar57 = maxps(auVar57,auVar36);
                pauVar20 = (undefined1 (*) [16])(*pauVar20 + lVar24);
                lVar8 = lVar8 + -1;
              } while (lVar8 != 0);
            }
            uVar15 = uVar15 + 1;
            bVar25 = uVar15 < uVar11;
            auVar36 = auVar66;
            auVar49 = auVar57;
          } while (uVar15 != uVar11);
        }
LAB_00d7de77:
        fVar83 = fVar27 * fVar35 - fVar34;
        fVar63 = auVar36._0_4_;
        fVar40 = auVar52._0_4_;
        fVar48 = auVar49._0_4_;
        fVar53 = auVar49._4_4_;
        fVar54 = auVar49._8_4_;
        fVar55 = auVar49._12_4_;
        fVar71 = auVar75._0_4_;
        fVar80 = auVar75._4_4_;
        fVar45 = auVar75._8_4_;
        fVar46 = auVar75._12_4_;
        fVar41 = auVar52._4_4_;
        fVar43 = auVar52._8_4_;
        fVar61 = auVar52._12_4_;
        fVar65 = auVar36._4_4_;
        fVar69 = auVar36._8_4_;
        fVar70 = auVar36._12_4_;
        if (iVar10 - iVar9 == 1) {
          if (fVar83 <= 0.0) {
            fVar83 = 0.0;
          }
          fVar34 = 1.0 - fVar83;
          auVar36._4_4_ = fVar34 * fVar41 + fVar83 * fVar65;
          auVar36._0_4_ = fVar34 * fVar40 + fVar83 * fVar63;
          auVar52._0_4_ = fVar34 * fVar71 + fVar83 * fVar48;
          auVar52._4_4_ = fVar34 * fVar80 + fVar83 * fVar53;
          auVar52._8_4_ = fVar34 * fVar45 + fVar83 * fVar54;
          auVar52._12_4_ = fVar34 * fVar46 + fVar83 * fVar55;
          fVar27 = fVar28 - fVar47;
          if (fVar28 - fVar47 <= 0.0) {
            fVar27 = 0.0;
          }
          fVar28 = 1.0 - fVar27;
          auVar37._0_4_ = fVar63 * fVar28 + fVar40 * fVar27;
          auVar37._4_4_ = fVar65 * fVar28 + fVar41 * fVar27;
          auVar37._8_4_ = fVar69 * fVar28 + fVar43 * fVar27;
          auVar37._12_4_ = fVar70 * fVar28 + fVar61 * fVar27;
          auVar67._0_4_ = fVar28 * fVar48 + fVar27 * fVar71;
          auVar67._4_4_ = fVar28 * fVar53 + fVar27 * fVar80;
          auVar67._8_4_ = fVar28 * fVar54 + fVar27 * fVar45;
          auVar67._12_4_ = fVar28 * fVar55 + fVar27 * fVar46;
          auVar36._8_4_ = fVar34 * fVar43 + fVar83 * fVar69;
          auVar36._12_4_ = fVar34 * fVar61 + fVar83 * fVar70;
        }
        else {
          auVar52 = _DAT_01feb9f0;
          auVar75 = _DAT_01feba00;
          if (uVar22 < uVar1) {
            uVar2 = *(ushort *)(lVar5 + 8 + lVar21);
            uVar13 = (ulong)uVar2;
            if (uVar19 + 3 < (ulong)uVar2) {
              uVar13 = uVar19 + 3;
            }
            bVar25 = true;
            lVar16 = (long)(int)fVar34 * 0x38;
            uVar15 = uVar23;
            auVar36 = _DAT_01feba00;
            auVar49 = _DAT_01feb9f0;
            do {
              if (uVar18 < uVar2) {
                uVar17 = *(ulong *)&pGVar4[2].numPrimitives;
                lVar24 = *(long *)(uVar17 + 0x48 + lVar16);
                pauVar20 = (undefined1 (*) [16])
                           ((*(uint *)(lVar5 + lVar21) + uVar19 +
                            *(uint *)(lVar5 + 4 + lVar21) * uVar15) * lVar24 +
                           *(long *)(uVar17 + 0x38 + lVar16));
                lVar8 = uVar13 - uVar19;
                do {
                  auVar52 = *pauVar20;
                  auVar57._4_4_ = -(uint)(auVar52._4_4_ < 1.844e+18 && -1.844e+18 < auVar52._4_4_);
                  auVar57._0_4_ = -(uint)(auVar52._0_4_ < 1.844e+18 && -1.844e+18 < auVar52._0_4_);
                  auVar57._8_4_ = -(uint)(auVar52._8_4_ < 1.844e+18 && -1.844e+18 < auVar52._8_4_);
                  auVar57._12_4_ =
                       -(uint)(auVar52._12_4_ < 1.844e+18 && -1.844e+18 < auVar52._12_4_);
                  uVar12 = movmskps((int)uVar17,auVar57);
                  uVar17 = (ulong)CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12);
                  if ((~(byte)uVar12 & 7) != 0) {
                    auVar52 = _DAT_01feb9f0;
                    auVar75 = _DAT_01feba00;
                    if (!bVar25) {
                      auVar52 = auVar49;
                      auVar75 = auVar36;
                    }
                    goto LAB_00d7dfbd;
                  }
                  auVar49 = minps(auVar49,auVar52);
                  auVar36 = maxps(auVar36,auVar52);
                  pauVar20 = (undefined1 (*) [16])(*pauVar20 + lVar24);
                  lVar8 = lVar8 + -1;
                } while (lVar8 != 0);
              }
              uVar15 = uVar15 + 1;
              bVar25 = uVar15 < uVar11;
              auVar52 = auVar49;
              auVar75 = auVar36;
            } while (uVar15 != uVar11);
          }
LAB_00d7dfbd:
          fVar34 = -INFINITY;
          fVar60 = -INFINITY;
          fVar62 = -INFINITY;
          fVar64 = -INFINITY;
          fVar76 = (float)DAT_01feb9f0;
          fVar79 = DAT_01feb9f0._4_4_;
          fVar81 = DAT_01feb9f0._8_4_;
          fVar82 = DAT_01feb9f0._12_4_;
          if (uVar22 < uVar1) {
            uVar2 = *(ushort *)(lVar5 + 8 + lVar21);
            uVar13 = (ulong)uVar2;
            if (uVar19 + 3 < (ulong)uVar2) {
              uVar13 = uVar19 + 3;
            }
            bVar25 = true;
            lVar16 = (long)(int)fVar28 * 0x38;
            uVar15 = uVar23;
            auVar36 = _DAT_01feba00;
            auVar49 = _DAT_01feb9f0;
            do {
              if (uVar18 < uVar2) {
                uVar17 = *(ulong *)&pGVar4[2].numPrimitives;
                lVar24 = *(long *)((uVar17 - 0x28) + lVar16);
                pauVar20 = (undefined1 (*) [16])
                           ((*(uint *)(lVar5 + lVar21) + uVar19 +
                            *(uint *)(lVar5 + 4 + lVar21) * uVar15) * lVar24 +
                           *(long *)((uVar17 - 0x38) + lVar16));
                lVar8 = uVar13 - uVar19;
                do {
                  auVar57 = *pauVar20;
                  auVar66._4_4_ = -(uint)(auVar57._4_4_ < 1.844e+18 && -1.844e+18 < auVar57._4_4_);
                  auVar66._0_4_ = -(uint)(auVar57._0_4_ < 1.844e+18 && -1.844e+18 < auVar57._0_4_);
                  auVar66._8_4_ = -(uint)(auVar57._8_4_ < 1.844e+18 && -1.844e+18 < auVar57._8_4_);
                  auVar66._12_4_ =
                       -(uint)(auVar57._12_4_ < 1.844e+18 && -1.844e+18 < auVar57._12_4_);
                  uVar12 = movmskps((int)uVar17,auVar66);
                  uVar17 = (ulong)CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12);
                  if ((~(byte)uVar12 & 7) != 0) {
                    fVar34 = -INFINITY;
                    fVar60 = -INFINITY;
                    fVar62 = -INFINITY;
                    fVar64 = -INFINITY;
                    fVar76 = (float)DAT_01feb9f0;
                    fVar79 = DAT_01feb9f0._4_4_;
                    fVar81 = DAT_01feb9f0._8_4_;
                    fVar82 = DAT_01feb9f0._12_4_;
                    if (!bVar25) {
                      fVar76 = auVar49._0_4_;
                      fVar79 = auVar49._4_4_;
                      fVar81 = auVar49._8_4_;
                      fVar82 = auVar49._12_4_;
                      fVar34 = auVar36._0_4_;
                      fVar60 = auVar36._4_4_;
                      fVar62 = auVar36._8_4_;
                      fVar64 = auVar36._12_4_;
                    }
                    goto LAB_00d7e093;
                  }
                  auVar49 = minps(auVar49,auVar57);
                  auVar36 = maxps(auVar36,auVar57);
                  pauVar20 = (undefined1 (*) [16])(*pauVar20 + lVar24);
                  lVar8 = lVar8 + -1;
                } while (lVar8 != 0);
              }
              uVar15 = uVar15 + 1;
              fVar34 = auVar36._0_4_;
              fVar60 = auVar36._4_4_;
              fVar62 = auVar36._8_4_;
              fVar64 = auVar36._12_4_;
              bVar25 = uVar15 < uVar11;
              fVar76 = auVar49._0_4_;
              fVar79 = auVar49._4_4_;
              fVar81 = auVar49._8_4_;
              fVar82 = auVar49._12_4_;
            } while (uVar15 != uVar11);
          }
LAB_00d7e093:
          if (fVar83 <= 0.0) {
            fVar83 = 0.0;
          }
          fVar56 = 1.0 - fVar83;
          auVar36._0_4_ = fVar40 * fVar56 + auVar52._0_4_ * fVar83;
          auVar36._4_4_ = fVar41 * fVar56 + auVar52._4_4_ * fVar83;
          auVar36._8_4_ = fVar43 * fVar56 + auVar52._8_4_ * fVar83;
          auVar36._12_4_ = fVar61 * fVar56 + auVar52._12_4_ * fVar83;
          auVar52._0_4_ = fVar56 * fVar71 + fVar83 * auVar75._0_4_;
          auVar52._4_4_ = fVar56 * fVar80 + fVar83 * auVar75._4_4_;
          auVar52._8_4_ = fVar56 * fVar45 + fVar83 * auVar75._8_4_;
          auVar52._12_4_ = fVar56 * fVar46 + fVar83 * auVar75._12_4_;
          fVar83 = fVar28 - fVar47;
          if (fVar28 - fVar47 <= 0.0) {
            fVar83 = 0.0;
          }
          fVar28 = 1.0 - fVar83;
          auVar37._0_4_ = fVar63 * fVar28 + fVar76 * fVar83;
          auVar37._4_4_ = fVar65 * fVar28 + fVar79 * fVar83;
          auVar37._8_4_ = fVar69 * fVar28 + fVar81 * fVar83;
          auVar37._12_4_ = fVar70 * fVar28 + fVar82 * fVar83;
          auVar67._0_4_ = fVar28 * fVar48 + fVar83 * fVar34;
          auVar67._4_4_ = fVar28 * fVar53 + fVar83 * fVar60;
          auVar67._8_4_ = fVar28 * fVar54 + fVar83 * fVar62;
          auVar67._12_4_ = fVar28 * fVar55 + fVar83 * fVar64;
          if ((int)(iVar9 + 1U) < iVar10) {
            uVar13 = (ulong)(iVar9 + 1U);
            do {
              auVar75 = _DAT_01feb9f0;
              auVar49 = _DAT_01feba00;
              if (uVar22 < uVar1) {
                uVar2 = *(ushort *)(lVar5 + 8 + lVar21);
                uVar15 = (ulong)uVar2;
                if (uVar19 + 3 < (ulong)uVar2) {
                  uVar15 = uVar19 + 3;
                }
                bVar25 = true;
                uVar17 = uVar23;
                auVar57 = _DAT_01feba00;
                auVar66 = _DAT_01feb9f0;
                do {
                  if (uVar18 < uVar2) {
                    uVar14 = uVar13 * 0x38;
                    lVar16 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x10 + uVar14);
                    pauVar20 = (undefined1 (*) [16])
                               ((*(uint *)(lVar5 + lVar21) + uVar19 +
                                *(uint *)(lVar5 + 4 + lVar21) * uVar17) * lVar16 +
                               *(long *)(*(long *)&pGVar4[2].numPrimitives + uVar14));
                    lVar24 = uVar15 - uVar19;
                    do {
                      auVar75 = *pauVar20;
                      auVar77._0_4_ =
                           -(uint)(auVar75._0_4_ < 1.844e+18 && -1.844e+18 < auVar75._0_4_);
                      auVar77._4_4_ =
                           -(uint)(auVar75._4_4_ < 1.844e+18 && -1.844e+18 < auVar75._4_4_);
                      auVar77._8_4_ =
                           -(uint)(auVar75._8_4_ < 1.844e+18 && -1.844e+18 < auVar75._8_4_);
                      auVar77._12_4_ =
                           -(uint)(auVar75._12_4_ < 1.844e+18 && -1.844e+18 < auVar75._12_4_);
                      uVar12 = movmskps((int)uVar14,auVar77);
                      uVar14 = (ulong)CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12);
                      if ((~(byte)uVar12 & 7) != 0) {
                        auVar75 = _DAT_01feb9f0;
                        auVar49 = _DAT_01feba00;
                        if (!bVar25) {
                          auVar75 = auVar66;
                          auVar49 = auVar57;
                        }
                        goto LAB_00d7e20b;
                      }
                      auVar66 = minps(auVar66,auVar75);
                      auVar57 = maxps(auVar57,auVar75);
                      pauVar20 = (undefined1 (*) [16])(*pauVar20 + lVar16);
                      lVar24 = lVar24 + -1;
                    } while (lVar24 != 0);
                  }
                  uVar17 = uVar17 + 1;
                  bVar25 = uVar17 < uVar11;
                  auVar75 = auVar66;
                  auVar49 = auVar57;
                } while (uVar17 != uVar11);
              }
LAB_00d7e20b:
              fVar28 = ((float)(int)uVar13 / fVar27 - fVar35) / (fVar31 - fVar35);
              fVar43 = 1.0 - fVar28;
              fVar40 = auVar37._4_4_;
              fVar41 = auVar37._12_4_;
              fVar80 = auVar37._8_4_;
              fVar34 = auVar36._4_4_;
              fVar47 = auVar36._8_4_;
              fVar83 = auVar36._12_4_;
              auVar50._0_4_ = auVar75._0_4_ - (auVar36._0_4_ * fVar43 + auVar37._0_4_ * fVar28);
              auVar50._4_4_ = auVar75._4_4_ - (fVar34 * fVar43 + fVar40 * fVar28);
              auVar50._8_4_ = auVar75._8_4_ - (fVar47 * fVar43 + fVar80 * fVar28);
              auVar50._12_4_ = auVar75._12_4_ - (fVar83 * fVar43 + fVar41 * fVar28);
              fVar69 = auVar67._4_4_;
              fVar70 = auVar67._8_4_;
              fVar71 = auVar67._12_4_;
              fVar61 = auVar52._4_4_;
              fVar63 = auVar52._8_4_;
              fVar65 = auVar52._12_4_;
              auVar72._0_4_ = auVar49._0_4_ - (fVar43 * auVar52._0_4_ + fVar28 * auVar67._0_4_);
              auVar72._4_4_ = auVar49._4_4_ - (fVar43 * fVar61 + fVar28 * fVar69);
              auVar72._8_4_ = auVar49._8_4_ - (fVar43 * fVar63 + fVar28 * fVar70);
              auVar72._12_4_ = auVar49._12_4_ - (fVar43 * fVar65 + fVar28 * fVar71);
              auVar75 = minps(auVar50,ZEXT816(0));
              auVar49 = maxps(auVar72,ZEXT816(0));
              auVar36._0_4_ = auVar36._0_4_ + auVar75._0_4_;
              auVar36._4_4_ = fVar34 + auVar75._4_4_;
              auVar36._8_4_ = fVar47 + auVar75._8_4_;
              auVar36._12_4_ = fVar83 + auVar75._12_4_;
              auVar37._0_4_ = auVar37._0_4_ + auVar75._0_4_;
              auVar37._4_4_ = fVar40 + auVar75._4_4_;
              auVar37._8_4_ = fVar80 + auVar75._8_4_;
              auVar37._12_4_ = fVar41 + auVar75._12_4_;
              auVar52._0_4_ = auVar52._0_4_ + auVar49._0_4_;
              auVar52._4_4_ = fVar61 + auVar49._4_4_;
              auVar52._8_4_ = fVar63 + auVar49._8_4_;
              auVar52._12_4_ = fVar65 + auVar49._12_4_;
              auVar67._0_4_ = auVar67._0_4_ + auVar49._0_4_;
              auVar67._4_4_ = fVar69 + auVar49._4_4_;
              auVar67._8_4_ = fVar70 + auVar49._8_4_;
              auVar67._12_4_ = fVar71 + auVar49._12_4_;
              uVar13 = uVar13 + 1;
            } while (iVar10 != (int)uVar13);
          }
        }
        aVar29.m128 = (__m128)minps(this->bounds0[0].bounds0.lower.field_0,auVar36);
        aVar32.m128 = (__m128)maxps(this->bounds0[0].bounds0.upper.field_0,auVar52);
        aVar44.m128 = (__m128)minps(this->bounds0[0].bounds1.lower.field_0,auVar37);
        aVar38.m128 = (__m128)maxps(this->bounds0[0].bounds1.upper.field_0,auVar67);
        this->bounds0[0].bounds0.lower.field_0 = aVar29;
        this->bounds0[0].bounds0.upper.field_0 = aVar32;
        this->bounds0[0].bounds1.lower.field_0 = aVar44;
        this->bounds0[0].bounds1.upper.field_0 = aVar38;
        fVar35 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar34 = prims[begin].time_range.lower;
        fVar31 = prims[begin].time_range.upper - fVar34;
        fVar28 = floorf(((fVar26 - fVar34) / fVar31) * 1.0000002 * fVar35);
        fVar27 = 0.0;
        if (0.0 <= fVar28) {
          fVar27 = fVar28;
        }
        fVar28 = ceilf(((fVar42 - fVar34) / fVar31) * 0.99999976 * fVar35);
        if (fVar35 <= fVar28) {
          fVar28 = fVar35;
        }
        this->count0[0] = this->count0[0] + (long)((int)fVar28 - (int)fVar27);
      }
      if ((fVar42 < prims[begin].time_range.upper * 0.9999) &&
         (prims[begin].time_range.lower * 1.0001 < fVar30)) {
        fVar27 = prims[begin].lbounds.bounds0.upper.field_0.m128[3];
        pSVar3 = recalculatePrimRef->sgrids;
        pGVar4 = (recalculatePrimRef->scene->geometries).items
                 [(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3]].ptr;
        uVar19 = (ulong)pSVar3[(uint)fVar27].sx & 0x7fff;
        uVar23 = (ulong)pSVar3[(uint)fVar27].sy & 0x7fff;
        lVar5 = *(long *)&pGVar4->field_0x58;
        lVar21 = (ulong)pSVar3[(uint)fVar27].primID *
                 pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
        fVar27 = pGVar4->fnumTimeSegments;
        fVar28 = (pGVar4->time_range).lower;
        fVar31 = (pGVar4->time_range).upper - fVar28;
        fVar35 = (fVar42 - fVar28) / fVar31;
        fVar31 = (fVar30 - fVar28) / fVar31;
        fVar47 = fVar27 * fVar31;
        fVar34 = floorf(fVar27 * fVar35);
        fVar28 = ceilf(fVar47);
        iVar9 = (int)fVar34;
        if (fVar34 <= 0.0) {
          fVar34 = 0.0;
        }
        if (iVar9 < 0) {
          iVar9 = -1;
        }
        iVar10 = (int)fVar27 + 1;
        if ((int)fVar28 < (int)fVar27 + 1) {
          iVar10 = (int)fVar28;
        }
        uVar1 = *(ushort *)(lVar5 + 10 + lVar21);
        uVar11 = (ulong)uVar1;
        if (uVar23 + 3 < (ulong)uVar1) {
          uVar11 = uVar23 + 3;
        }
        uVar22 = (ushort)uVar23;
        uVar18 = (ushort)uVar19;
        auVar52 = _DAT_01feb9f0;
        auVar75 = _DAT_01feba00;
        if (uVar22 < uVar1) {
          uVar2 = *(ushort *)(lVar5 + 8 + lVar21);
          uVar13 = (ulong)uVar2;
          if (uVar19 + 3 < (ulong)uVar2) {
            uVar13 = uVar19 + 3;
          }
          bVar25 = true;
          uVar15 = uVar23;
          auVar36 = _DAT_01feba00;
          auVar49 = _DAT_01feb9f0;
          do {
            if (uVar18 < uVar2) {
              uVar17 = *(ulong *)&pGVar4[2].numPrimitives;
              lVar24 = (long)(int)fVar34 * 0x38;
              lVar16 = *(long *)(uVar17 + 0x10 + lVar24);
              pauVar20 = (undefined1 (*) [16])
                         ((*(uint *)(lVar5 + lVar21) + uVar19 +
                          *(uint *)(lVar5 + 4 + lVar21) * uVar15) * lVar16 +
                         *(long *)(uVar17 + lVar24));
              lVar24 = uVar13 - uVar19;
              do {
                auVar52 = *pauVar20;
                auVar58._0_4_ = -(uint)(auVar52._0_4_ < 1.844e+18 && -1.844e+18 < auVar52._0_4_);
                auVar58._4_4_ = -(uint)(auVar52._4_4_ < 1.844e+18 && -1.844e+18 < auVar52._4_4_);
                auVar58._8_4_ = -(uint)(auVar52._8_4_ < 1.844e+18 && -1.844e+18 < auVar52._8_4_);
                auVar58._12_4_ = -(uint)(auVar52._12_4_ < 1.844e+18 && -1.844e+18 < auVar52._12_4_);
                uVar12 = movmskps((int)uVar17,auVar58);
                uVar17 = (ulong)CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12);
                if ((~(byte)uVar12 & 7) != 0) {
                  auVar52 = _DAT_01feb9f0;
                  auVar75 = _DAT_01feba00;
                  if (!bVar25) {
                    auVar52 = auVar49;
                    auVar75 = auVar36;
                  }
                  goto LAB_00d7e5bf;
                }
                auVar49 = minps(auVar49,auVar52);
                auVar36 = maxps(auVar36,auVar52);
                pauVar20 = (undefined1 (*) [16])(*pauVar20 + lVar16);
                lVar24 = lVar24 + -1;
              } while (lVar24 != 0);
            }
            uVar15 = uVar15 + 1;
            bVar25 = uVar15 < uVar11;
            auVar52 = auVar49;
            auVar75 = auVar36;
          } while (uVar15 != uVar11);
        }
LAB_00d7e5bf:
        if (fVar27 <= fVar28) {
          fVar28 = fVar27;
        }
        auVar36 = _DAT_01feb9f0;
        auVar49 = _DAT_01feba00;
        if (uVar22 < uVar1) {
          uVar2 = *(ushort *)(lVar5 + 8 + lVar21);
          uVar13 = (ulong)uVar2;
          if (uVar19 + 3 < (ulong)uVar2) {
            uVar13 = uVar19 + 3;
          }
          bVar25 = true;
          lVar16 = (long)(int)fVar28 * 0x38;
          uVar15 = uVar23;
          auVar57 = _DAT_01feba00;
          auVar66 = _DAT_01feb9f0;
          do {
            if (uVar18 < uVar2) {
              uVar17 = *(ulong *)&pGVar4[2].numPrimitives;
              lVar24 = *(long *)(uVar17 + 0x10 + lVar16);
              pauVar20 = (undefined1 (*) [16])
                         ((*(uint *)(lVar5 + lVar21) + uVar19 +
                          *(uint *)(lVar5 + 4 + lVar21) * uVar15) * lVar24 +
                         *(long *)(uVar17 + lVar16));
              lVar8 = uVar13 - uVar19;
              do {
                auVar36 = *pauVar20;
                auVar73._0_4_ = -(uint)(auVar36._0_4_ < 1.844e+18 && -1.844e+18 < auVar36._0_4_);
                auVar73._4_4_ = -(uint)(auVar36._4_4_ < 1.844e+18 && -1.844e+18 < auVar36._4_4_);
                auVar73._8_4_ = -(uint)(auVar36._8_4_ < 1.844e+18 && -1.844e+18 < auVar36._8_4_);
                auVar73._12_4_ = -(uint)(auVar36._12_4_ < 1.844e+18 && -1.844e+18 < auVar36._12_4_);
                uVar12 = movmskps((int)uVar17,auVar73);
                uVar17 = (ulong)CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12);
                if ((~(byte)uVar12 & 7) != 0) {
                  auVar36 = _DAT_01feb9f0;
                  auVar49 = _DAT_01feba00;
                  if (!bVar25) {
                    auVar36 = auVar66;
                    auVar49 = auVar57;
                  }
                  goto LAB_00d7e6a1;
                }
                auVar66 = minps(auVar66,auVar36);
                auVar57 = maxps(auVar57,auVar36);
                pauVar20 = (undefined1 (*) [16])(*pauVar20 + lVar24);
                lVar8 = lVar8 + -1;
              } while (lVar8 != 0);
            }
            uVar15 = uVar15 + 1;
            bVar25 = uVar15 < uVar11;
            auVar36 = auVar66;
            auVar49 = auVar57;
          } while (uVar15 != uVar11);
        }
LAB_00d7e6a1:
        fVar83 = fVar27 * fVar35 - fVar34;
        fVar63 = auVar36._0_4_;
        fVar40 = auVar52._0_4_;
        fVar48 = auVar49._0_4_;
        fVar53 = auVar49._4_4_;
        fVar54 = auVar49._8_4_;
        fVar55 = auVar49._12_4_;
        fVar71 = auVar75._0_4_;
        fVar80 = auVar75._4_4_;
        fVar45 = auVar75._8_4_;
        fVar46 = auVar75._12_4_;
        fVar41 = auVar52._4_4_;
        fVar43 = auVar52._8_4_;
        fVar61 = auVar52._12_4_;
        fVar65 = auVar36._4_4_;
        fVar69 = auVar36._8_4_;
        fVar70 = auVar36._12_4_;
        if (iVar10 - iVar9 == 1) {
          if (fVar83 <= 0.0) {
            fVar83 = 0.0;
          }
          fVar34 = 1.0 - fVar83;
          auVar33._4_4_ = fVar34 * fVar41 + fVar83 * fVar65;
          auVar33._0_4_ = fVar34 * fVar40 + fVar83 * fVar63;
          auVar59._0_4_ = fVar34 * fVar71 + fVar83 * fVar48;
          auVar59._4_4_ = fVar34 * fVar80 + fVar83 * fVar53;
          auVar59._8_4_ = fVar34 * fVar45 + fVar83 * fVar54;
          auVar59._12_4_ = fVar34 * fVar46 + fVar83 * fVar55;
          fVar27 = fVar28 - fVar47;
          if (fVar28 - fVar47 <= 0.0) {
            fVar27 = 0.0;
          }
          fVar28 = 1.0 - fVar27;
          auVar39._0_4_ = fVar63 * fVar28 + fVar40 * fVar27;
          auVar39._4_4_ = fVar65 * fVar28 + fVar41 * fVar27;
          auVar39._8_4_ = fVar69 * fVar28 + fVar43 * fVar27;
          auVar39._12_4_ = fVar70 * fVar28 + fVar61 * fVar27;
          auVar68._0_4_ = fVar28 * fVar48 + fVar27 * fVar71;
          auVar68._4_4_ = fVar28 * fVar53 + fVar27 * fVar80;
          auVar68._8_4_ = fVar28 * fVar54 + fVar27 * fVar45;
          auVar68._12_4_ = fVar28 * fVar55 + fVar27 * fVar46;
          auVar33._8_4_ = fVar34 * fVar43 + fVar83 * fVar69;
          auVar33._12_4_ = fVar34 * fVar61 + fVar83 * fVar70;
        }
        else {
          auVar52 = _DAT_01feb9f0;
          auVar75 = _DAT_01feba00;
          if (uVar22 < uVar1) {
            uVar2 = *(ushort *)(lVar5 + 8 + lVar21);
            uVar13 = (ulong)uVar2;
            if (uVar19 + 3 < (ulong)uVar2) {
              uVar13 = uVar19 + 3;
            }
            bVar25 = true;
            lVar16 = (long)(int)fVar34 * 0x38;
            uVar15 = uVar23;
            auVar36 = _DAT_01feba00;
            auVar49 = _DAT_01feb9f0;
            do {
              if (uVar18 < uVar2) {
                uVar17 = *(ulong *)&pGVar4[2].numPrimitives;
                lVar24 = *(long *)(uVar17 + 0x48 + lVar16);
                pauVar20 = (undefined1 (*) [16])
                           ((*(uint *)(lVar5 + lVar21) + uVar19 +
                            *(uint *)(lVar5 + 4 + lVar21) * uVar15) * lVar24 +
                           *(long *)(uVar17 + 0x38 + lVar16));
                lVar8 = uVar13 - uVar19;
                do {
                  auVar52 = *pauVar20;
                  auVar6._4_4_ = -(uint)(auVar52._4_4_ < 1.844e+18 && -1.844e+18 < auVar52._4_4_);
                  auVar6._0_4_ = -(uint)(auVar52._0_4_ < 1.844e+18 && -1.844e+18 < auVar52._0_4_);
                  auVar6._8_4_ = -(uint)(auVar52._8_4_ < 1.844e+18 && -1.844e+18 < auVar52._8_4_);
                  auVar6._12_4_ = -(uint)(auVar52._12_4_ < 1.844e+18 && -1.844e+18 < auVar52._12_4_)
                  ;
                  uVar12 = movmskps((int)uVar17,auVar6);
                  uVar17 = (ulong)CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12);
                  if ((~(byte)uVar12 & 7) != 0) {
                    auVar52 = _DAT_01feb9f0;
                    auVar75 = _DAT_01feba00;
                    if (!bVar25) {
                      auVar52 = auVar49;
                      auVar75 = auVar36;
                    }
                    goto LAB_00d7e7e3;
                  }
                  auVar49 = minps(auVar49,auVar52);
                  auVar36 = maxps(auVar36,auVar52);
                  pauVar20 = (undefined1 (*) [16])(*pauVar20 + lVar24);
                  lVar8 = lVar8 + -1;
                } while (lVar8 != 0);
              }
              uVar15 = uVar15 + 1;
              bVar25 = uVar15 < uVar11;
              auVar52 = auVar49;
              auVar75 = auVar36;
            } while (uVar15 != uVar11);
          }
LAB_00d7e7e3:
          fVar34 = -INFINITY;
          fVar60 = -INFINITY;
          fVar62 = -INFINITY;
          fVar64 = -INFINITY;
          fVar76 = (float)DAT_01feb9f0;
          fVar79 = DAT_01feb9f0._4_4_;
          fVar81 = DAT_01feb9f0._8_4_;
          fVar82 = DAT_01feb9f0._12_4_;
          if (uVar22 < uVar1) {
            uVar2 = *(ushort *)(lVar5 + 8 + lVar21);
            uVar13 = (ulong)uVar2;
            if (uVar19 + 3 < (ulong)uVar2) {
              uVar13 = uVar19 + 3;
            }
            bVar25 = true;
            lVar16 = (long)(int)fVar28 * 0x38;
            uVar15 = uVar23;
            auVar36 = _DAT_01feba00;
            auVar49 = _DAT_01feb9f0;
            do {
              if (uVar18 < uVar2) {
                uVar17 = *(ulong *)&pGVar4[2].numPrimitives;
                lVar24 = *(long *)((uVar17 - 0x28) + lVar16);
                pauVar20 = (undefined1 (*) [16])
                           ((*(uint *)(lVar5 + lVar21) + uVar19 +
                            *(uint *)(lVar5 + 4 + lVar21) * uVar15) * lVar24 +
                           *(long *)((uVar17 - 0x38) + lVar16));
                lVar8 = uVar13 - uVar19;
                do {
                  auVar57 = *pauVar20;
                  auVar7._4_4_ = -(uint)(auVar57._4_4_ < 1.844e+18 && -1.844e+18 < auVar57._4_4_);
                  auVar7._0_4_ = -(uint)(auVar57._0_4_ < 1.844e+18 && -1.844e+18 < auVar57._0_4_);
                  auVar7._8_4_ = -(uint)(auVar57._8_4_ < 1.844e+18 && -1.844e+18 < auVar57._8_4_);
                  auVar7._12_4_ = -(uint)(auVar57._12_4_ < 1.844e+18 && -1.844e+18 < auVar57._12_4_)
                  ;
                  uVar12 = movmskps((int)uVar17,auVar7);
                  uVar17 = (ulong)CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12);
                  if ((~(byte)uVar12 & 7) != 0) {
                    fVar34 = -INFINITY;
                    fVar60 = -INFINITY;
                    fVar62 = -INFINITY;
                    fVar64 = -INFINITY;
                    fVar76 = (float)DAT_01feb9f0;
                    fVar79 = DAT_01feb9f0._4_4_;
                    fVar81 = DAT_01feb9f0._8_4_;
                    fVar82 = DAT_01feb9f0._12_4_;
                    if (!bVar25) {
                      fVar76 = auVar49._0_4_;
                      fVar79 = auVar49._4_4_;
                      fVar81 = auVar49._8_4_;
                      fVar82 = auVar49._12_4_;
                      fVar34 = auVar36._0_4_;
                      fVar60 = auVar36._4_4_;
                      fVar62 = auVar36._8_4_;
                      fVar64 = auVar36._12_4_;
                    }
                    goto LAB_00d7e8b9;
                  }
                  auVar49 = minps(auVar49,auVar57);
                  auVar36 = maxps(auVar36,auVar57);
                  pauVar20 = (undefined1 (*) [16])(*pauVar20 + lVar24);
                  lVar8 = lVar8 + -1;
                } while (lVar8 != 0);
              }
              uVar15 = uVar15 + 1;
              fVar34 = auVar36._0_4_;
              fVar60 = auVar36._4_4_;
              fVar62 = auVar36._8_4_;
              fVar64 = auVar36._12_4_;
              bVar25 = uVar15 < uVar11;
              fVar76 = auVar49._0_4_;
              fVar79 = auVar49._4_4_;
              fVar81 = auVar49._8_4_;
              fVar82 = auVar49._12_4_;
            } while (uVar15 != uVar11);
          }
LAB_00d7e8b9:
          if (fVar83 <= 0.0) {
            fVar83 = 0.0;
          }
          fVar56 = 1.0 - fVar83;
          auVar33._0_4_ = fVar40 * fVar56 + auVar52._0_4_ * fVar83;
          auVar33._4_4_ = fVar41 * fVar56 + auVar52._4_4_ * fVar83;
          auVar33._8_4_ = fVar43 * fVar56 + auVar52._8_4_ * fVar83;
          auVar33._12_4_ = fVar61 * fVar56 + auVar52._12_4_ * fVar83;
          auVar59._0_4_ = fVar56 * fVar71 + fVar83 * auVar75._0_4_;
          auVar59._4_4_ = fVar56 * fVar80 + fVar83 * auVar75._4_4_;
          auVar59._8_4_ = fVar56 * fVar45 + fVar83 * auVar75._8_4_;
          auVar59._12_4_ = fVar56 * fVar46 + fVar83 * auVar75._12_4_;
          fVar83 = fVar28 - fVar47;
          if (fVar28 - fVar47 <= 0.0) {
            fVar83 = 0.0;
          }
          fVar28 = 1.0 - fVar83;
          auVar39._0_4_ = fVar63 * fVar28 + fVar76 * fVar83;
          auVar39._4_4_ = fVar65 * fVar28 + fVar79 * fVar83;
          auVar39._8_4_ = fVar69 * fVar28 + fVar81 * fVar83;
          auVar39._12_4_ = fVar70 * fVar28 + fVar82 * fVar83;
          auVar68._0_4_ = fVar28 * fVar48 + fVar83 * fVar34;
          auVar68._4_4_ = fVar28 * fVar53 + fVar83 * fVar60;
          auVar68._8_4_ = fVar28 * fVar54 + fVar83 * fVar62;
          auVar68._12_4_ = fVar28 * fVar55 + fVar83 * fVar64;
          if ((int)(iVar9 + 1U) < iVar10) {
            uVar13 = (ulong)(iVar9 + 1U);
            do {
              auVar52 = _DAT_01feb9f0;
              auVar75 = _DAT_01feba00;
              if (uVar22 < uVar1) {
                uVar2 = *(ushort *)(lVar5 + 8 + lVar21);
                uVar15 = (ulong)uVar2;
                if (uVar19 + 3 < (ulong)uVar2) {
                  uVar15 = uVar19 + 3;
                }
                bVar25 = true;
                uVar17 = uVar23;
                auVar36 = _DAT_01feba00;
                auVar49 = _DAT_01feb9f0;
                do {
                  if (uVar18 < uVar2) {
                    uVar14 = uVar13 * 0x38;
                    lVar16 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x10 + uVar14);
                    pauVar20 = (undefined1 (*) [16])
                               ((*(uint *)(lVar5 + lVar21) + uVar19 +
                                *(uint *)(lVar5 + 4 + lVar21) * uVar17) * lVar16 +
                               *(long *)(*(long *)&pGVar4[2].numPrimitives + uVar14));
                    lVar24 = uVar15 - uVar19;
                    do {
                      auVar52 = *pauVar20;
                      auVar78._0_4_ =
                           -(uint)(auVar52._0_4_ < 1.844e+18 && -1.844e+18 < auVar52._0_4_);
                      auVar78._4_4_ =
                           -(uint)(auVar52._4_4_ < 1.844e+18 && -1.844e+18 < auVar52._4_4_);
                      auVar78._8_4_ =
                           -(uint)(auVar52._8_4_ < 1.844e+18 && -1.844e+18 < auVar52._8_4_);
                      auVar78._12_4_ =
                           -(uint)(auVar52._12_4_ < 1.844e+18 && -1.844e+18 < auVar52._12_4_);
                      uVar12 = movmskps((int)uVar14,auVar78);
                      uVar14 = (ulong)CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12);
                      if ((~(byte)uVar12 & 7) != 0) {
                        auVar52 = _DAT_01feb9f0;
                        auVar75 = _DAT_01feba00;
                        if (!bVar25) {
                          auVar52 = auVar49;
                          auVar75 = auVar36;
                        }
                        goto LAB_00d7ea35;
                      }
                      auVar49 = minps(auVar49,auVar52);
                      auVar36 = maxps(auVar36,auVar52);
                      pauVar20 = (undefined1 (*) [16])(*pauVar20 + lVar16);
                      lVar24 = lVar24 + -1;
                    } while (lVar24 != 0);
                  }
                  uVar17 = uVar17 + 1;
                  bVar25 = uVar17 < uVar11;
                  auVar52 = auVar49;
                  auVar75 = auVar36;
                } while (uVar17 != uVar11);
              }
LAB_00d7ea35:
              fVar28 = ((float)(int)uVar13 / fVar27 - fVar35) / (fVar31 - fVar35);
              fVar43 = 1.0 - fVar28;
              fVar40 = auVar39._4_4_;
              fVar41 = auVar39._12_4_;
              fVar80 = auVar39._8_4_;
              fVar34 = auVar33._4_4_;
              fVar47 = auVar33._8_4_;
              fVar83 = auVar33._12_4_;
              auVar51._0_4_ = auVar52._0_4_ - (auVar33._0_4_ * fVar43 + auVar39._0_4_ * fVar28);
              auVar51._4_4_ = auVar52._4_4_ - (fVar34 * fVar43 + fVar40 * fVar28);
              auVar51._8_4_ = auVar52._8_4_ - (fVar47 * fVar43 + fVar80 * fVar28);
              auVar51._12_4_ = auVar52._12_4_ - (fVar83 * fVar43 + fVar41 * fVar28);
              fVar69 = auVar68._4_4_;
              fVar70 = auVar68._8_4_;
              fVar71 = auVar68._12_4_;
              fVar61 = auVar59._4_4_;
              fVar63 = auVar59._8_4_;
              fVar65 = auVar59._12_4_;
              auVar74._0_4_ = auVar75._0_4_ - (fVar43 * auVar59._0_4_ + fVar28 * auVar68._0_4_);
              auVar74._4_4_ = auVar75._4_4_ - (fVar43 * fVar61 + fVar28 * fVar69);
              auVar74._8_4_ = auVar75._8_4_ - (fVar43 * fVar63 + fVar28 * fVar70);
              auVar74._12_4_ = auVar75._12_4_ - (fVar43 * fVar65 + fVar28 * fVar71);
              auVar52 = minps(auVar51,ZEXT816(0));
              auVar75 = maxps(auVar74,ZEXT816(0));
              auVar33._0_4_ = auVar33._0_4_ + auVar52._0_4_;
              auVar33._4_4_ = fVar34 + auVar52._4_4_;
              auVar33._8_4_ = fVar47 + auVar52._8_4_;
              auVar33._12_4_ = fVar83 + auVar52._12_4_;
              auVar39._0_4_ = auVar39._0_4_ + auVar52._0_4_;
              auVar39._4_4_ = fVar40 + auVar52._4_4_;
              auVar39._8_4_ = fVar80 + auVar52._8_4_;
              auVar39._12_4_ = fVar41 + auVar52._12_4_;
              auVar59._0_4_ = auVar59._0_4_ + auVar75._0_4_;
              auVar59._4_4_ = fVar61 + auVar75._4_4_;
              auVar59._8_4_ = fVar63 + auVar75._8_4_;
              auVar59._12_4_ = fVar65 + auVar75._12_4_;
              auVar68._0_4_ = auVar68._0_4_ + auVar75._0_4_;
              auVar68._4_4_ = fVar69 + auVar75._4_4_;
              auVar68._8_4_ = fVar70 + auVar75._8_4_;
              auVar68._12_4_ = fVar71 + auVar75._12_4_;
              uVar13 = uVar13 + 1;
            } while (iVar10 != (int)uVar13);
          }
        }
        aVar29.m128 = (__m128)minps(this->bounds1[0].bounds0.lower.field_0,auVar33);
        aVar32.m128 = (__m128)maxps(this->bounds1[0].bounds0.upper.field_0,auVar59);
        aVar44.m128 = (__m128)minps(this->bounds1[0].bounds1.lower.field_0,auVar39);
        aVar38.m128 = (__m128)maxps(this->bounds1[0].bounds1.upper.field_0,auVar68);
        this->bounds1[0].bounds0.lower.field_0 = aVar29;
        this->bounds1[0].bounds0.upper.field_0 = aVar32;
        this->bounds1[0].bounds1.lower.field_0 = aVar44;
        this->bounds1[0].bounds1.upper.field_0 = aVar38;
        fVar35 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar34 = prims[begin].time_range.lower;
        fVar31 = prims[begin].time_range.upper - fVar34;
        fVar28 = floorf(((fVar42 - fVar34) / fVar31) * 1.0000002 * fVar35);
        fVar27 = 0.0;
        if (0.0 <= fVar28) {
          fVar27 = fVar28;
        }
        fVar28 = ceilf(((fVar30 - fVar34) / fVar31) * 0.99999976 * fVar35);
        if (fVar35 <= fVar28) {
          fVar28 = fVar35;
        }
        this->count1[0] = this->count1[0] + (long)((int)fVar28 - (int)fVar27);
      }
      begin = begin + 1;
    } while (begin != end);
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }